

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O2

Vector3 * __thiscall AML::Vector3::operator/=(Vector3 *this,double s)

{
  undefined1 auVar1 [16];
  
  auVar1._8_8_ = s;
  auVar1._0_8_ = s;
  auVar1 = divpd(*(undefined1 (*) [16])&this->field_0,auVar1);
  *(undefined1 (*) [16])&this->field_0 = auVar1;
  (this->field_0).data[2] = (this->field_0).data[2] / s;
  return this;
}

Assistant:

Vector3& Vector3::operator/=(double s)
    {
        x /= s;
        y /= s;
        z /= s;
        return *this;
    }